

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

int64_t __thiscall rcg::Device::getModuleEvent(Device *this,int64_t _timeout)

{
  PEventGetData p_Var1;
  EVENT_HANDLE pvVar2;
  PEventGetDataInfo p_Var3;
  IPort IVar4;
  element_type *peVar5;
  bool bVar6;
  GC_ERROR GVar7;
  int iVar8;
  size_type sVar9;
  element_type *peVar10;
  reference pvVar11;
  element_type *peVar12;
  uchar *puVar13;
  undefined8 uVar14;
  uchar *puVar15;
  CEventAdapterGeneric *this_00;
  element_type *peVar16;
  element_type *peVar17;
  uint64_t in_RSI;
  long in_RDI;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *this_01;
  exception *anon_var_0;
  INFO_DATATYPE type_2;
  int32_t value_1;
  size_t tmp_size;
  char tmp [80];
  INFO_DATATYPE type_1;
  lock_guard<std::mutex> lock;
  GC_ERROR err;
  size_t size;
  size_t i;
  size_t size_1;
  INFO_DATATYPE type;
  size_t value;
  lock_guard<std::mutex> lock_1;
  uint64_t timeout;
  int64_t eventid;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000340;
  string *in_stack_00000348;
  GenTLException *in_stack_00000350;
  char *in_stack_00000b00;
  CPort *in_stack_00000b08;
  void *in_stack_00000b10;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000b18;
  mutex_type *in_stack_fffffffffffffd28;
  size_t *__idx;
  CPort *__p;
  string *in_stack_fffffffffffffd30;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_fffffffffffffd38;
  CPort *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd50;
  allocator local_179;
  string local_178 [36];
  INFO_DATATYPE local_154;
  int local_150;
  allocator local_149;
  string local_148 [38];
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  size_t local_100;
  int local_f8 [20];
  INFO_DATATYPE local_a8;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [44];
  int local_74;
  CPort local_70;
  size_t local_50;
  INFO_DATATYPE local_44;
  undefined8 local_40;
  int local_34;
  uint64_t local_28;
  long local_20;
  uint64_t local_18;
  long local_8;
  
  local_20 = -1;
  local_28 = 0xffffffffffffffff;
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (-1 < (long)local_18) {
    local_28 = local_18;
  }
  if (*(long *)(in_RDI + 0x90) == 0) {
    local_8 = -3;
    local_34 = 1;
  }
  else {
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x98));
    if (sVar9 == 0) {
      local_40 = 0;
      local_50 = 8;
      peVar12 = std::
                __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x117230);
      GVar7 = (*peVar12->EventGetInfo)
                        (*(EVENT_HANDLE *)(in_RDI + 0x90),3,&local_44,&local_40,&local_50);
      if (GVar7 == 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
    }
    for (local_70.gentl.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr = (element_type *)0x0;
        peVar5 = local_70.gentl.
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar10 = (element_type *)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x98)), peVar5 < peVar10;
        local_70.gentl.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 ((long)&(local_70.gentl.
                          super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->GCGetInfo + 1)) {
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x98),
                           (size_type)
                           local_70.gentl.
                           super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      *pvVar11 = '\0';
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0),
                           (size_type)
                           local_70.gentl.
                           super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      *pvVar11 = '\0';
    }
    local_34 = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11738c);
  if (local_34 == 0) {
    local_70.super_IPort =
         (IPort)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x98))
    ;
    peVar12 = std::
              __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1173cb);
    p_Var1 = peVar12->EventGetData;
    pvVar2 = *(EVENT_HANDLE *)(in_RDI + 0x90);
    puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1173fa);
    local_74 = (*p_Var1)(pvVar2,puVar13,(size_t *)&local_70,local_28);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    if (local_74 == -0x3f3) {
      local_8 = -1;
    }
    else if (local_74 == -0x3f4) {
      local_8 = -2;
    }
    else {
      if (local_74 != 0) {
        local_a2 = 1;
        uVar14 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"Device::getModuleEvent()",&local_a1);
        GenTLException::GenTLException(in_stack_00000350,in_stack_00000348,in_stack_00000340);
        local_a2 = 0;
        __cxa_throw(uVar14,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      local_a8 = 0;
      local_100 = 0x50;
      peVar12 = std::
                __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1175c5);
      p_Var3 = peVar12->EventGetDataInfo;
      pvVar2 = *(EVENT_HANDLE *)(in_RDI + 0x90);
      puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1175f4);
      __idx = &local_100;
      local_74 = (*p_Var3)(pvVar2,puVar13,(size_t)local_70.super_IPort,0,&local_a8,local_f8,__idx);
      if (local_74 != 0) {
        local_122 = 1;
        uVar14 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"Device::getModuleEvent()",&local_121);
        GenTLException::GenTLException(in_stack_00000350,in_stack_00000348,in_stack_00000340);
        local_122 = 0;
        __cxa_throw(uVar14,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      if (local_a8 == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,(char *)local_f8,&local_149);
        iVar8 = std::__cxx11::stoi(in_stack_fffffffffffffd30,__idx,0);
        local_20 = (long)iVar8;
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
      else if (local_a8 == 5) {
        local_150 = local_f8[0];
        local_20 = (long)local_f8[0];
      }
      local_154 = 0;
      local_70.super_IPort =
           (IPort)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0xb0));
      peVar12 = std::
                __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1178b2);
      p_Var3 = peVar12->EventGetDataInfo;
      pvVar2 = *(EVENT_HANDLE *)(in_RDI + 0x90);
      puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1178de);
      IVar4 = local_70.super_IPort;
      puVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1178fa);
      __p = &local_70;
      local_74 = (*p_Var3)(pvVar2,puVar13,(size_t)IVar4,1,&local_154,puVar15,(size_t *)__p);
      if (local_74 != 0) {
        uVar14 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"Device::getModuleEvent()",&local_179);
        GenTLException::GenTLException(in_stack_00000350,in_stack_00000348,in_stack_00000340);
        __cxa_throw(uVar14,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xe8));
      if (!bVar6) {
        operator_new(0x20);
        std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
                  ((shared_ptr<const_rcg::GenTLWrapper> *)in_stack_fffffffffffffd30,
                   (shared_ptr<const_rcg::GenTLWrapper> *)__p);
        CPort::CPort(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (void **)in_stack_fffffffffffffd30);
        std::shared_ptr<rcg::CPort>::shared_ptr<rcg::CPort,void>
                  ((shared_ptr<rcg::CPort> *)in_stack_fffffffffffffd30,__p);
        this_01 = (__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 200);
        std::shared_ptr<rcg::CPort>::operator=
                  ((shared_ptr<rcg::CPort> *)in_stack_fffffffffffffd30,(shared_ptr<rcg::CPort> *)__p
                  );
        std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x117afa);
        std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
                  ((shared_ptr<const_rcg::GenTLWrapper> *)0x117b07);
        std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
                  ((shared_ptr<const_rcg::GenTLWrapper> *)in_stack_fffffffffffffd30,
                   (shared_ptr<const_rcg::GenTLWrapper> *)__p);
        std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
        allocNodeMap(in_stack_00000b18,in_stack_00000b10,in_stack_00000b08,in_stack_00000b00);
        std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
                  ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffffd30,
                   (shared_ptr<GenApi_3_4::CNodeMapRef> *)__p);
        std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x117b8d);
        std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
                  ((shared_ptr<const_rcg::GenTLWrapper> *)0x117b9a);
      }
      bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x108));
      if (!bVar6) {
        this_00 = (CEventAdapterGeneric *)operator_new(0x20);
        peVar16 = std::
                  __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x117c3f);
        GenApi_3_4::CEventAdapterGeneric::CEventAdapterGeneric
                  (this_00,(peVar16->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr)
        ;
        std::shared_ptr<GenApi_3_4::CEventAdapterGeneric>::
        shared_ptr<GenApi_3_4::CEventAdapterGeneric,void>
                  ((shared_ptr<GenApi_3_4::CEventAdapterGeneric> *)in_stack_fffffffffffffd30,
                   (CEventAdapterGeneric *)__p);
        std::shared_ptr<GenApi_3_4::CEventAdapterGeneric>::operator=
                  ((shared_ptr<GenApi_3_4::CEventAdapterGeneric> *)in_stack_fffffffffffffd30,
                   (shared_ptr<GenApi_3_4::CEventAdapterGeneric> *)__p);
        std::shared_ptr<GenApi_3_4::CEventAdapterGeneric>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CEventAdapterGeneric> *)0x117c8c);
      }
      if (0 < local_20) {
        peVar17 = std::
                  __shared_ptr_access<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x117d33);
        puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x117d4c);
        (**(code **)(*(long *)peVar17 + 0x30))
                  (peVar17,puVar13,(ulong)local_70.super_IPort & 0xffffffff,local_20);
      }
      local_8 = local_20;
    }
    local_34 = 1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x117d7f);
  }
  return local_8;
}

Assistant:

int64_t Device::getModuleEvent(int64_t _timeout)
{
  int64_t eventid=-1;
  uint64_t timeout=GENTL_INFINITE;

  {
    std::lock_guard<std::mutex> lock(mtx);

    if (_timeout >= 0)
    {
      timeout=static_cast<uint64_t>(_timeout);
    }

    // check that streaming had been started

    if (event == 0)
    {
      return -3;
    }

    // determine memory for receiving the event

    if (event_buffer.size() == 0)
    {
      size_t value=0;

      GenTL::INFO_DATATYPE type;
      size_t size=sizeof(value);

      if (gentl->EventGetInfo(event, GenTL::EVENT_SIZE_MAX, &type, &value, &size) == GenTL::GC_ERR_SUCCESS)
      {
        event_buffer.resize(value);
        event_value.resize(value);
      }
    }

    // clear buffer

    for (size_t i=0; i<event_buffer.size(); i++)
    {
      event_buffer[i]=0;
      event_value[i]=0;
    }
  }

  // get event data

  size_t size=event_buffer.size();

  GenTL::GC_ERROR err=gentl->EventGetData(event, event_buffer.data(), &size, timeout);

  std::lock_guard<std::mutex> lock(mtx);

  // return 0 in case of abort and timeout and throw exception in case of
  // another error

  if (err == GenTL::GC_ERR_TIMEOUT)
  {
    return -1;
  }
  else if (err == GenTL::GC_ERR_ABORT)
  {
    return -2;
  }
  else if (err != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("Device::getModuleEvent()", gentl);
  }

  // get event ID

  {
    GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
    char tmp[80];
    size_t tmp_size=sizeof(tmp);

    err=gentl->EventGetDataInfo(event, event_buffer.data(), size, GenTL::EVENT_DATA_ID,
      &type, tmp, &tmp_size);

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getModuleEvent()", gentl);
    }

    if (type == GenTL::INFO_DATATYPE_STRING)
    {
      eventid=std::stoi(std::string(tmp), 0, 16);
    }
    else if (type == GenTL::INFO_DATATYPE_INT32)
    {
      int32_t value=0;
      memcpy(&value, tmp, sizeof(value));
      eventid=value;
    }
  }

  // get event value

  {
    GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
    size=event_value.size();

    err=gentl->EventGetDataInfo(event, event_buffer.data(), size, GenTL::EVENT_DATA_VALUE,
      &type, event_value.data(), &size);

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getModuleEvent()", gentl);
    }
  }

  if (!nodemap)
  {
    cport=std::shared_ptr<CPort>(new CPort(gentl, &dev));
    nodemap=allocNodeMap(gentl, dev, cport.get(), 0);
  }

  try
  {
    if (!eventadapter)
    {
      eventadapter=std::shared_ptr<GenApi::CEventAdapterGeneric>(new GenApi::CEventAdapterGeneric(nodemap->_Ptr));
    }

    if (eventid > 0)
    {
      eventadapter->DeliverMessage(event_value.data(), size, static_cast<uint64_t>(eventid));
    }
  }
  catch (const std::exception &)
  { }

  return eventid;
}